

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O1

void __thiscall
sptk::reaper::EpochTracker::NormalizeAmplitude
          (EpochTracker *this,vector<float,_std::allocator<float>_> *input,float sample_rate,
          vector<float,_std::allocator<float>_> *output)

{
  pointer pfVar1;
  pointer pfVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  uVar6 = (uint)(this->ref_dur_ * sample_rate + 0.5);
  iVar3 = (int)((ulong)((long)(input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  std::vector<float,_std::allocator<float>_>::resize(output,(long)iVar3);
  iVar5 = 0;
  Window(this,input,0,(long)(int)uVar6,
         (output->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
         ._M_start);
  if (iVar3 - uVar6 == 0 || iVar3 < (int)uVar6) {
    dVar14 = 0.0;
  }
  else {
    iVar9 = (int)(sample_rate * this->internal_frame_interval_ + 0.5);
    lVar11 = 0;
    lVar10 = 0;
    iVar5 = 0;
    dVar14 = 0.0;
    iVar7 = (int)uVar6 / 2;
    do {
      dVar13 = 1.0;
      if (0 < (int)uVar6) {
        uVar4 = 0;
        dVar13 = 1.0;
        do {
          dVar12 = (double)((this->window_).super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar4] *
                           *(float *)((long)(input->
                                            super__Vector_base<float,_std::allocator<float>_>).
                                            _M_impl.super__Vector_impl_data._M_start +
                                     uVar4 * 4 + lVar11));
          dVar13 = dVar13 + dVar12 * dVar12;
          uVar4 = uVar4 + 1;
        } while (uVar6 != uVar4);
      }
      dVar13 = (double)(int)uVar6 / dVar13;
      if (dVar13 < 0.0) {
        dVar13 = sqrt(dVar13);
      }
      else {
        dVar13 = SQRT(dVar13);
      }
      if (lVar10 < 1) {
        dVar12 = 0.0;
        dVar14 = dVar13;
      }
      else {
        dVar12 = (dVar13 - dVar14) / (double)iVar9;
      }
      if (0 < iVar7) {
        pfVar1 = (input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar2 = (output->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar8 = 0;
        do {
          pfVar2[iVar5 + lVar8] = (float)((double)pfVar1[iVar5 + lVar8] * dVar14);
          dVar14 = dVar14 + dVar12;
          lVar8 = lVar8 + 1;
        } while (iVar7 != (int)lVar8);
        iVar5 = iVar5 + (int)lVar8;
      }
      lVar10 = lVar10 + iVar9;
      lVar11 = lVar11 + (long)iVar9 * 4;
      iVar7 = iVar9;
    } while (lVar10 < (long)(ulong)(iVar3 - uVar6));
  }
  if (iVar5 < iVar3) {
    pfVar1 = (input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar2 = (output->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = (long)iVar5;
    do {
      pfVar2[lVar10] = (float)((double)pfVar1[lVar10] * dVar14);
      lVar10 = lVar10 + 1;
    } while (iVar3 != lVar10);
  }
  return;
}

Assistant:

void EpochTracker::NormalizeAmplitude(const std::vector<float>& input,
                                      float sample_rate,
                                      std::vector<float>* output) {
  int32_t n_input = input.size();
  int32_t ref_size = RoundUp(sample_rate * ref_dur_);
  std::vector<float> wind;

  output->resize(n_input);
  // Just calling Window here to create a Hann window in window_.
  Window(input, 0, ref_size, &(output->front()));
  int32_t ref_by_2 = ref_size / 2;
  int32_t frame_step = RoundUp(sample_rate * internal_frame_interval_);
  int32_t limit = n_input - ref_size;
  int32_t frame_limit = ref_by_2;
  int32_t data_p = 0;
  int32_t frame_p = 0;
  double old_inv_rms = 0.0;
  while (frame_p < limit) {
    double ref_energy = 1.0;  // to prevent divz
    for (int32_t i = 0; i < ref_size; ++i) {
      double val = window_[i] * input[i + frame_p];
      ref_energy += (val * val);
    }
    double inv_rms = sqrt(static_cast<double>(ref_size) / ref_energy);
    double delta_inv_rms = 0.0;
    if (frame_p > 0) {
      delta_inv_rms = (inv_rms - old_inv_rms) / frame_step;
    } else {
      old_inv_rms = inv_rms;
    }
    for (int i = 0; i < frame_limit; ++i, ++data_p) {
      (*output)[data_p] = input[data_p] * old_inv_rms;
      old_inv_rms += delta_inv_rms;
    }
    frame_limit = frame_step;
    frame_p += frame_step;
  }
  for ( ; data_p < n_input; ++data_p) {
    (*output)[data_p] = input[data_p] * old_inv_rms;
  }
}